

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_reader.c
# Opt level: O3

lafe_line_reader * lafe_line_reader(char *pathname,int nullSeparator)

{
  lafe_line_reader *plVar1;
  char *pcVar2;
  FILE *pFVar3;
  int *piVar4;
  int code;
  
  plVar1 = (lafe_line_reader *)calloc(1,0x48);
  if (plVar1 == (lafe_line_reader *)0x0) {
    pcVar2 = "Can\'t open %s";
    code = 0xc;
  }
  else {
    plVar1->nullSeparator = nullSeparator;
    pcVar2 = strdup(pathname);
    plVar1->pathname = pcVar2;
    if ((*pathname != '-') || (pFVar3 = _stdin, pathname[1] != '\0')) {
      pFVar3 = fopen(pathname,"r");
    }
    plVar1->f = (FILE *)pFVar3;
    if (pFVar3 != (FILE *)0x0) {
      plVar1->buff_length = 0x2000;
      return plVar1;
    }
    piVar4 = __errno_location();
    code = *piVar4;
    pcVar2 = "Couldn\'t open %s";
  }
  lafe_errc(1,code,pcVar2,pathname);
}

Assistant:

struct lafe_line_reader *
lafe_line_reader(const char *pathname, int nullSeparator)
{
	struct lafe_line_reader *lr;

	lr = calloc(1, sizeof(*lr));
	if (lr == NULL)
		lafe_errc(1, ENOMEM, "Can't open %s", pathname);

	lr->nullSeparator = nullSeparator;
	lr->pathname = strdup(pathname);

	if (strcmp(pathname, "-") == 0)
		lr->f = stdin;
	else
		lr->f = fopen(pathname, "r");
	if (lr->f == NULL)
		lafe_errc(1, errno, "Couldn't open %s", pathname);
	lr->buff_length = 8192;
	lr->line_start = lr->line_end = lr->buff_end = lr->buff = NULL;

	return (lr);
}